

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void ffcfmt(char *tform,char *cform)

{
  int iVar1;
  ushort **ppuVar2;
  bool bVar3;
  bool bVar4;
  int local_28;
  int npt;
  int isgood;
  int istart;
  int ii;
  char *cform_local;
  char *tform_local;
  
  *cform = '\0';
  isgood = 0;
  while( true ) {
    iVar1 = isgood;
    bVar3 = false;
    if (tform[isgood] != '\0') {
      bVar3 = tform[isgood] == ' ';
    }
    if (!bVar3) break;
    isgood = isgood + 1;
  }
  if (tform[isgood] != '\0') {
    bVar3 = true;
    local_28 = 0;
    if ((((tform[isgood] != 'A') && (tform[isgood] != 'I')) && (tform[isgood] != 'F')) &&
       ((tform[isgood] != 'E' && (tform[isgood] != 'D')))) {
      bVar3 = false;
    }
    while( true ) {
      isgood = isgood + 1;
      bVar4 = false;
      if (bVar3) {
        bVar4 = tform[isgood] != '\0';
      }
      if (!bVar4) break;
      if (tform[isgood] == '.') {
        if (local_28 < 1) {
          local_28 = local_28 + 1;
        }
        else {
          bVar3 = false;
        }
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)tform[isgood]] & 0x800) == 0) {
          bVar3 = false;
        }
      }
    }
    if (bVar3) {
      *cform = '%';
      strcpy(cform + 1,tform + (iVar1 + 1));
      if (tform[iVar1] == 'A') {
        strcat(cform,"s");
      }
      else if (tform[iVar1] == 'I') {
        strcat(cform,".0f");
      }
      if (tform[iVar1] == 'F') {
        strcat(cform,"f");
      }
      if (tform[iVar1] == 'E') {
        strcat(cform,"E");
      }
      if (tform[iVar1] == 'D') {
        strcat(cform,"E");
      }
    }
  }
  return;
}

Assistant:

void ffcfmt(char *tform,    /* value of an ASCII table TFORMn keyword */
            char *cform)    /* equivalent format code in C language syntax */
/*
  convert the FITS format string for an ASCII Table extension column into the
  equivalent C format string that can be used in a printf statement, after
  the values have been read as a double.
*/
{
    int ii, istart, isgood, npt;
    
    cform[0] = '\0';
    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (tform[ii] == 0)
        return;    /* input format string was blank */
    istart = ii;
    
    isgood = 1;
    npt = 0;
    if (tform[ii] != 'A' && tform[ii] != 'I' && tform[ii] != 'F'
                 && tform[ii] != 'E' && tform[ii] != 'D')
       isgood = 0;
    ii++;
    while (isgood && tform[ii] != 0)
    {
       /* one period is allowed */
       if (tform[ii] == '.')
       {
          if (npt > 0)
            isgood = 0;
          else
            ++npt; 
       }
       else if (!isdigit(tform[ii]))
          isgood = 0;
       ++ii; 
    }
    if (!isgood)
       return;

    cform[0] = '%';  /* start the format string */

    strcpy(&cform[1], &tform[istart + 1]); /* append the width and decimal code */


    if (tform[istart] == 'A')
        strcat(cform, "s");
    else if (tform[istart] == 'I')
        strcat(cform, ".0f");  /*  0 precision to suppress decimal point */
    if (tform[istart] == 'F')
        strcat(cform, "f");
    if (tform[istart] == 'E')
        strcat(cform, "E");
    if (tform[istart] == 'D')
        strcat(cform, "E");

    return;
}